

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

size_t value_to_string(CrispyValue value,char **dest)

{
  size_t __n;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 dict;
  char *dict_string;
  ObjString *obj_string;
  Object *object;
  char s [23];
  size_t str_len;
  char *string;
  char **dest_local;
  CrispyValue value_local;
  
  dict = value.field_1;
  str_len = 0;
  stack0xffffffffffffffd0 = 0;
  switch(value.type) {
  case NIL:
    str_len = (size_t)strdup("nil");
    stack0xffffffffffffffd0 = 3;
    break;
  case NUMBER:
    snprintf((char *)&object,0x17,"%.15g",dict.d_value);
    str_len = (size_t)strdup((char *)&object);
    register0x00000000 = strlen((char *)&object);
    break;
  case OBJECT:
    switch((dict.o_value)->type) {
    case OBJ_STRING:
      str_len = (size_t)malloc(*(long *)(dict.p_value + 0x10) + 3);
      __n._0_4_ = ((HashTable *)(dict.p_value + 0x10))->key_type;
      __n._4_4_ = ((HashTable *)(dict.p_value + 0x10))->cap;
      memcpy((undefined1 *)(str_len + 1),*(void **)(dict.p_value + 0x18),__n);
      *(undefined1 *)str_len = 0x22;
      *(undefined1 *)(str_len + *(long *)(dict.p_value + 0x10) + 1) = 0x22;
      *(undefined1 *)(str_len + *(long *)(dict.p_value + 0x10) + 2) = 0;
      register0x00000000 = *(long *)(dict.p_value + 0x10) + 2;
      break;
    case OBJ_LAMBDA:
      str_len = (size_t)strdup("<function>");
      stack0xffffffffffffffd0 = 10;
      break;
    case OBJ_NATIVE_FUNC:
      str_len = (size_t)strdup("<native function>");
      stack0xffffffffffffffd0 = 0x11;
      break;
    case OBJ_DICT:
      str_len = (size_t)dict_to_string((ObjDict *)dict.o_value);
      register0x00000000 = strlen((char *)str_len);
      break;
    case OBJ_LIST:
      str_len = (size_t)strdup("<list>");
      stack0xffffffffffffffd0 = 6;
    }
    break;
  case BOOLEAN:
    if ((ObjDict *)dict.p_value == (ObjDict *)0x0) {
      str_len = (size_t)strdup("false");
      stack0xffffffffffffffd0 = 5;
    }
    else {
      str_len = (size_t)strdup("true");
      stack0xffffffffffffffd0 = 4;
    }
  }
  *dest = (char *)str_len;
  return stack0xffffffffffffffd0;
}

Assistant:

size_t value_to_string(CrispyValue value, char **dest) {
    char *string = NULL;
    size_t str_len = 0;

    switch (value.type) {
        case NUMBER: {
            char s[23];
            snprintf(s, 23, "%.15g", value.d_value);
            string = strdup(s);
            str_len = strlen(s);
            break;
        }
        case OBJECT: {
            Object *object = value.o_value;

            switch (object->type) {
                case OBJ_STRING: {
                    ObjString *obj_string = ((ObjString *) object);
                    string = malloc((obj_string->length + 3) * sizeof(char));
                    memcpy(string + 1, obj_string->start, obj_string->length);
                    string[0] = '"';
                    string[obj_string->length + 1] = '"';
                    string[obj_string->length + 2] = '\0';
                    str_len = ((ObjString *) object)->length + 2;
                    break;
                }
                case OBJ_LAMBDA:
                    // TODO arity
                    string = strdup("<function>");
                    str_len = 10;
                    break;
                case OBJ_NATIVE_FUNC:
                    // TODO arity
                    string = strdup("<native function>");
                    str_len = 17;
                    break;
                case OBJ_DICT: {
                    char *dict_string = dict_to_string((ObjDict *) object);
                    string = dict_string;
                    str_len = strlen(dict_string);
                    break;
                }
                case OBJ_LIST:
                    // TODO implement properly
                    string = strdup("<list>");
                    str_len = 6;
                    break;
            }
            break;
        }
        case BOOLEAN: {
            if (value.p_value) {
                string = strdup("true");
                str_len = 4;
            } else {
                string = strdup("false");
                str_len = 5;
            }
            break;
        }
        case NIL:
            string = strdup("nil");
            str_len = 3;
            break;
    }

    *dest = string;
    return str_len;
}